

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O1

void pcs_ready(PrimeCandidateSource *s)

{
  size_t *allocated;
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  uintmax_t uVar4;
  avoid *paVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  size_t i;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  size_t sVar19;
  
  init_smallprimes();
  uVar2 = mp_hs_integer(s->addend,0x10000);
  uVar18 = 0x10000;
  if (uVar2 == 0) {
    uVar4 = mp_get_integer(s->addend);
    uVar18 = (uint)uVar4;
  }
  allocated = &s->avoidsize;
  lVar15 = 0;
  do {
    if (uVar18 <= smallprimes_array[lVar15]) break;
    paVar5 = (avoid *)safegrowarray(s->avoids,allocated,8,s->navoids,1,false);
    s->avoids = paVar5;
    sVar19 = s->navoids;
    paVar5[sVar19].mod = (uint)smallprimes_array[lVar15];
    paVar5[sVar19].res = 0;
    s->navoids = sVar19 + 1;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x198e);
  if (s->try_sophie_germain == true) {
    lVar15 = 0;
    do {
      if (uVar18 <= smallprimes_array[lVar15]) break;
      if (smallprimes_array[lVar15] != 2) {
        paVar5 = (avoid *)safegrowarray(s->avoids,allocated,8,s->navoids,1,false);
        s->avoids = paVar5;
        uVar1 = smallprimes_array[lVar15];
        sVar19 = s->navoids;
        paVar5[sVar19].mod = (uint)uVar1;
        paVar5[sVar19].res = (int)(((uint)uVar1 - ((int)(uVar1 - 1) >> 0x1f)) + -1) >> 1;
        s->navoids = sVar19 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x198e);
  }
  if (s->avoid_modulus != 0) {
    paVar5 = (avoid *)safegrowarray(s->avoids,allocated,8,s->navoids,1,false);
    s->avoids = paVar5;
    sVar19 = s->navoids;
    paVar5[sVar19].mod = s->avoid_modulus;
    paVar5[sVar19].res = s->avoid_residue;
    s->navoids = sVar19 + 1;
  }
  qsort(s->avoids,s->navoids,8,avoid_cmp);
  if (s->navoids == 0) {
    sVar19 = 0;
  }
  else {
    uVar14 = 0;
    sVar19 = 0;
    uVar11 = 0;
    uVar16 = 0;
    uVar10 = 0;
    do {
      uVar2 = s->avoids[uVar14].mod;
      uVar17 = (ulong)uVar2;
      uVar9 = (ulong)s->avoids[uVar14].res;
      if (uVar11 != uVar17) {
        uVar3 = mp_mod_known_integer(s->addend,uVar2);
        uVar16 = (ulong)uVar3;
        uVar3 = mp_mod_known_integer(s->factor,uVar2);
        uVar10 = (ulong)uVar3;
        uVar11 = uVar17;
      }
      if (uVar10 == 0) {
        if (uVar9 == uVar16) {
          __assert_fail("res != addend_m",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                        ,0x15d,"void pcs_ready(PrimeCandidateSource *)");
        }
      }
      else {
        uVar6 = uVar17;
        uVar8 = uVar10;
        lVar15 = 0;
        lVar13 = 1;
        do {
          lVar12 = lVar13;
          uVar7 = uVar8;
          uVar8 = (long)uVar6 % (long)uVar7;
          lVar13 = lVar15 - ((long)uVar6 / (long)uVar7) * lVar12;
          uVar6 = uVar7;
          lVar15 = lVar12;
        } while (uVar8 != 0);
        if ((uVar7 != 0xffffffffffffffff) && (uVar7 != 1)) {
          __assert_fail("v1 == 1 || v1 == -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                        ,0xff,"uint64_t invert(uint64_t, uint64_t)");
        }
        lVar15 = (long)(uVar7 * lVar12 * (uVar9 - uVar16)) % (long)uVar17;
        paVar5 = s->avoids;
        paVar5[sVar19].mod = uVar2;
        paVar5[sVar19].res = (int)lVar15 + ((uint)(lVar15 >> 0x3f) & uVar2);
        sVar19 = sVar19 + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < s->navoids);
  }
  s->navoids = sVar19;
  s->ready = true;
  return;
}

Assistant:

void pcs_ready(PrimeCandidateSource *s)
{
    /*
     * List all the small (modulus, residue) pairs we want to avoid.
     */

    init_smallprimes();

#define ADD_AVOID(newmod, newres) do {                          \
        sgrowarray(s->avoids, s->avoidsize, s->navoids);        \
        s->avoids[s->navoids].mod = (newmod);                   \
        s->avoids[s->navoids].res = (newres);                   \
        s->navoids++;                                           \
    } while (0)

    unsigned limit = (mp_hs_integer(s->addend, 65536) ? 65536 :
                      mp_get_integer(s->addend));

    /*
     * Don't be divisible by any small prime, or at least, any prime
     * smaller than our output number might actually manage to be. (If
     * asked to generate a really small prime, it would be
     * embarrassing to rule out legitimate answers on the grounds that
     * they were divisible by themselves.)
     */
    for (size_t i = 0; i < NSMALLPRIMES && smallprimes[i] < limit; i++)
        ADD_AVOID(smallprimes[i], 0);

    if (s->try_sophie_germain) {
        /*
         * If we're aiming to generate a Sophie Germain prime (i.e. p
         * such that 2p+1 is also prime), then we also want to ensure
         * 2p+1 is not congruent to 0 mod any small prime, because if
         * it is, we'll waste a lot of time generating a p for which
         * 2p+1 can't possibly work. So we have to avoid an extra
         * residue mod each odd q.
         *
         * We can simplify:        2p+1 ==  0      (mod q)
         *                    =>     2p == -1      (mod q)
         *                    =>      p == -2^{-1} (mod q)
         *
         * There's no need to do Euclid's algorithm to compute those
         * inverses, because for any odd q, the modular inverse of -2
         * mod q is just (q-1)/2. (Proof: multiplying it by -2 gives
         * 1-q, which is congruent to 1 mod q.)
         */
        for (size_t i = 0; i < NSMALLPRIMES && smallprimes[i] < limit; i++)
            if (smallprimes[i] != 2)
                ADD_AVOID(smallprimes[i], (smallprimes[i] - 1) / 2);
    }

    /*
     * Finally, if there's a particular modulus and residue we've been
     * told to avoid, put it on the list.
     */
    if (s->avoid_modulus)
        ADD_AVOID(s->avoid_modulus, s->avoid_residue);

#undef ADD_AVOID

    /*
     * Sort our to-avoid list by modulus. Partly this is so that we'll
     * check the smaller moduli first during the live runs, which lets
     * us spot most failing cases earlier rather than later. Also, it
     * brings equal moduli together, so that we can reuse the residue
     * we computed from a previous one.
     */
    qsort(s->avoids, s->navoids, sizeof(*s->avoids), avoid_cmp);

    /*
     * Next, adjust each of these moduli to take account of our factor
     * and addend. If we want factor*x+addend to avoid being congruent
     * to 'res' modulo 'mod', then x itself must avoid being congruent
     * to (res - addend) * factor^{-1}.
     *
     * If factor == 0 modulo mod, then the answer will have a fixed
     * residue anyway, so we can discard it from our list to test.
     */
    int64_t factor_m = 0, addend_m = 0, last_mod = 0;

    size_t out = 0;
    for (size_t i = 0; i < s->navoids; i++) {
        int64_t mod = s->avoids[i].mod, res = s->avoids[i].res;
        if (mod != last_mod) {
            last_mod = mod;
            addend_m = mp_mod_known_integer(s->addend, mod);
            factor_m = mp_mod_known_integer(s->factor, mod);
        }

        if (factor_m == 0) {
            assert(res != addend_m);
            continue;
        }

        res = (res - addend_m) * invert(factor_m, mod);
        res %= mod;
        if (res < 0)
            res += mod;

        s->avoids[out].mod = mod;
        s->avoids[out].res = res;
        out++;
    }

    s->navoids = out;

    s->ready = true;
}